

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fireworks.cpp
# Opt level: O0

bool __thiscall Fireworks::displayAnimation(Fireworks *this,Screen *screen)

{
  int streamerColor_00;
  int iVar1;
  int explosionColor;
  int explosionColor_00;
  int iVar2;
  int iVar3;
  bool local_251;
  int local_250;
  int iStack_24c;
  bool activeFireworkFlag;
  int delay2;
  int delay1;
  Firework firework3;
  undefined1 local_188 [8];
  Firework firework2;
  Firework firework1;
  int explosionColors [3];
  int streamerColor;
  Screen *screen_local;
  Fireworks *this_local;
  
  Screen::startAnimation(screen);
  streamerColor_00 = Screen::createColor(screen,3,0);
  iVar1 = Screen::createColor(screen,6,0);
  explosionColor = Screen::createColor(screen,2,0);
  explosionColor_00 = Screen::createColor(screen,5,0);
  Firework::Firework((Firework *)&firework2.explosionFrameCounter,'o','|',':','.');
  Firework::Firework((Firework *)local_188,'o','|',':','x');
  Firework::Firework((Firework *)&delay2,'o','|',':','.');
  iVar2 = Screen::getScreenSizeX(screen);
  if (iVar2 < 0) {
    iVar2 = iVar2 + 3;
  }
  iVar3 = Screen::getScreenSizeY(screen);
  Firework::initializeFirework
            ((Firework *)&firework2.explosionFrameCounter,iVar2 >> 2,iVar3 / 2,0xc,streamerColor_00,
             iVar1,screen);
  iVar2 = Screen::getScreenSizeX(screen);
  if (iVar2 < 0) {
    iVar2 = iVar2 + 3;
  }
  iVar1 = Screen::getScreenSizeY(screen);
  Firework::initializeFirework
            ((Firework *)local_188,(iVar2 >> 2) * 3,iVar1 / 2,0xe,streamerColor_00,explosionColor,
             screen);
  iVar2 = Screen::getScreenSizeX(screen);
  iVar1 = Screen::getScreenSizeY(screen);
  Firework::initializeFirework
            ((Firework *)&delay2,iVar2 / 2,iVar1 / 2,0x10,streamerColor_00,explosionColor_00,screen)
  ;
  iStack_24c = 0xc;
  local_250 = 0x18;
  local_251 = true;
  while (local_251 != false) {
    Screen::clearScreen(screen);
    local_251 = Firework::display((Firework *)&firework2.explosionFrameCounter,screen);
    if (iStack_24c < 1) {
      local_251 = Firework::display((Firework *)local_188,screen);
    }
    else {
      iStack_24c = iStack_24c + -1;
    }
    if (local_250 < 1) {
      local_251 = Firework::display((Firework *)&delay2,screen);
    }
    else {
      local_250 = local_250 + -1;
    }
    Screen::refreshScreen(screen);
    usleep(0xa2c2);
  }
  Screen::endAnimation(screen);
  Firework::~Firework((Firework *)&delay2);
  Firework::~Firework((Firework *)local_188);
  Firework::~Firework((Firework *)&firework2.explosionFrameCounter);
  return true;
}

Assistant:

bool Fireworks::displayAnimation(Screen &screen){

    screen.startAnimation();

    // Create the colors
    int streamerColor = screen.createColor(COLOR_YELLOW, COLOR_BLACK);
    int explosionColors[3];
    explosionColors[0] = screen.createColor(COLOR_CYAN, COLOR_BLACK);
    explosionColors[1] = screen.createColor(COLOR_GREEN, COLOR_BLACK);
    explosionColors[2] = screen.createColor(COLOR_MAGENTA, COLOR_BLACK);
    Firework firework1('o', '|', ':', '.');
    Firework firework2('o', '|', ':', 'x');
    Firework firework3('o', '|', ':', '.');

    firework1.initializeFirework(screen.getScreenSizeX() / 4,
                                 screen.getScreenSizeY() / 2,
                                 12,
                                 streamerColor,
                                 explosionColors[0],
                                 screen);

    firework2.initializeFirework(screen.getScreenSizeX() / 4 * 3,
                                 screen.getScreenSizeY() / 2,
                                 14,
                                 streamerColor,
                                 explosionColors[1],
                                 screen);
    firework3.initializeFirework(screen.getScreenSizeX() / 2,
                                 screen.getScreenSizeY() / 2,
                                 16,
                                 streamerColor,
                                 explosionColors[2],
                                 screen);

    // Set the delay between the two fireworks
    int delay1 = 1 * FRAMES_PER_SECOND / 2;
    int delay2 = delay1 * 2;
    bool activeFireworkFlag = true;

    // Loop until both fireworks are done displaying
    while (activeFireworkFlag){
        screen.clearScreen();
        activeFireworkFlag = firework1.display(screen);

        // Delay the second firework
        if (delay1 > 0){
            delay1 --;
        }
        else {
            activeFireworkFlag = firework2.display(screen);
        }

        if(delay2 > 0){
            delay2--;
        }
        else {
            activeFireworkFlag = firework3.display(screen);
        }

        screen.refreshScreen();
        usleep(MICROSECONDS_PER_SECOND / FRAMES_PER_SECOND);
    }


    screen.endAnimation();
    return true;
}